

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

void absl::lts_20250127::anon_unknown_1::AppendNumberUnit(string *out,int64_t n,DisplayUnit unit)

{
  char *pcVar1;
  const_pointer pvVar2;
  char *bp;
  char *ep;
  char buf [17];
  int64_t n_local;
  string *out_local;
  
  pcVar1 = Format64(buf + 9,0,n);
  if ((*pcVar1 != '0') || (pcVar1 + 1 != buf + 9)) {
    std::__cxx11::string::append((char *)out,(ulong)pcVar1);
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data(&unit.abbr);
    std::basic_string_view<char,_std::char_traits<char>_>::size(&unit.abbr);
    std::__cxx11::string::append((char *)out,(ulong)pvVar2);
  }
  return;
}

Assistant:

void AppendNumberUnit(std::string* out, int64_t n, DisplayUnit unit) {
  char buf[sizeof("2562047788015216")];  // hours in max duration
  char* const ep = buf + sizeof(buf);
  char* bp = Format64(ep, 0, n);
  if (*bp != '0' || bp + 1 != ep) {
    out->append(bp, static_cast<size_t>(ep - bp));
    out->append(unit.abbr.data(), unit.abbr.size());
  }
}